

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O1

void RemoveUVSeams(aiMesh *mesh,aiVector3D *out)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  aiFace *paVar9;
  ulong uVar10;
  ulong uVar11;
  uint n;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  
  if (mesh->mNumFaces != 0) {
    uVar14 = 0;
    do {
      uVar2 = mesh->mFaces[uVar14].mNumIndices;
      uVar10 = (ulong)uVar2;
      if (2 < uVar10) {
        paVar9 = mesh->mFaces + uVar14;
        uVar12 = 0;
        bVar3 = false;
        uVar11 = uVar10;
        uVar13 = uVar2;
        bVar7 = false;
        bVar5 = false;
        do {
          fVar1 = out[paVar9->mIndices[uVar12]].x;
          bVar8 = bVar7;
          bVar4 = true;
          if (0.01 < fVar1) {
            bVar8 = true;
            bVar4 = bVar5;
          }
          uVar6 = (uint)uVar12;
          if (0.1 <= fVar1) {
            uVar6 = uVar13;
            bVar8 = bVar7;
            bVar4 = bVar5;
          }
          uVar13 = uVar6;
          if (0.9 < fVar1) {
            if (0.99 <= fVar1) {
              bVar3 = true;
            }
            uVar11 = uVar12 & 0xffffffff;
          }
          uVar12 = uVar12 + 1;
          bVar7 = bVar8;
          bVar5 = bVar4;
        } while (uVar10 != uVar12);
        if (((uVar13 != uVar2) && ((uint)uVar11 != uVar2)) && (paVar9->mNumIndices != 0)) {
          uVar10 = 0;
          do {
            fVar1 = out[paVar9->mIndices[uVar10]].x;
            if (((0.9 < fVar1) && (fVar15 = 0.0, !bVar4)) || (fVar15 = 1.0, fVar1 < 0.1 && !bVar3))
            goto LAB_003bf8cf;
            if ((bool)(bVar3 & bVar4)) {
              if (bVar8) {
                fVar15 = 0.0;
                if (0.99 <= fVar1) {
LAB_003bf8cf:
                  out[paVar9->mIndices[uVar10]].x = fVar15;
                }
              }
              else {
                fVar15 = 1.0;
                if (fVar1 <= 0.01) goto LAB_003bf8cf;
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < paVar9->mNumIndices);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < mesh->mNumFaces);
  }
  return;
}

Assistant:

void RemoveUVSeams (aiMesh* mesh, aiVector3D* out)
{
    // TODO: just a very rough algorithm. I think it could be done
    // much easier, but I don't know how and am currently too tired to
    // to think about a better solution.

    const static ai_real LOWER_LIMIT = ai_real( 0.1 );
    const static ai_real UPPER_LIMIT = ai_real( 0.9 );

    const static ai_real LOWER_EPSILON = ai_real( 10e-3 );
    const static ai_real UPPER_EPSILON = ai_real( 1.0-10e-3 );

    for (unsigned int fidx = 0; fidx < mesh->mNumFaces;++fidx)
    {
        const aiFace& face = mesh->mFaces[fidx];
        if (face.mNumIndices < 3) continue; // triangles and polygons only, please

        unsigned int small = face.mNumIndices, large = small;
        bool zero = false, one = false, round_to_zero = false;

        // Check whether this face lies on a UV seam. We can just guess,
        // but the assumption that a face with at least one very small
        // on the one side and one very large U coord on the other side
        // lies on a UV seam should work for most cases.
        for (unsigned int n = 0; n < face.mNumIndices;++n)
        {
            if (out[face.mIndices[n]].x < LOWER_LIMIT)
            {
                small = n;

                // If we have a U value very close to 0 we can't
                // round the others to 0, too.
                if (out[face.mIndices[n]].x <= LOWER_EPSILON)
                    zero = true;
                else round_to_zero = true;
            }
            if (out[face.mIndices[n]].x > UPPER_LIMIT)
            {
                large = n;

                // If we have a U value very close to 1 we can't
                // round the others to 1, too.
                if (out[face.mIndices[n]].x >= UPPER_EPSILON)
                    one = true;
            }
        }
        if (small != face.mNumIndices && large != face.mNumIndices)
        {
            for (unsigned int n = 0; n < face.mNumIndices;++n)
            {
                // If the u value is over the upper limit and no other u
                // value of that face is 0, round it to 0
                if (out[face.mIndices[n]].x > UPPER_LIMIT && !zero)
                    out[face.mIndices[n]].x = 0.0;

                // If the u value is below the lower limit and no other u
                // value of that face is 1, round it to 1
                else if (out[face.mIndices[n]].x < LOWER_LIMIT && !one)
                    out[face.mIndices[n]].x = 1.0;

                // The face contains both 0 and 1 as UV coords. This can occur
                // for faces which have an edge that lies directly on the seam.
                // Due to numerical inaccuracies one U coord becomes 0, the
                // other 1. But we do still have a third UV coord to determine
                // to which side we must round to.
                else if (one && zero)
                {
                    if (round_to_zero && out[face.mIndices[n]].x >=  UPPER_EPSILON)
                        out[face.mIndices[n]].x = 0.0;
                    else if (!round_to_zero && out[face.mIndices[n]].x <= LOWER_EPSILON)
                        out[face.mIndices[n]].x = 1.0;
                }
            }
        }
    }
}